

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::decompressETC2_EAC_RGBA8(PixelBufferAccess *dst,deUint8 *src)

{
  int iVar1;
  void *pvVar2;
  deUint64 src_00;
  deUint64 src_01;
  undefined1 *puVar3;
  long lVar4;
  deUint8 *dstPixel;
  deUint8 *srcPixelAlpha;
  deUint8 *srcPixelRGB;
  int x;
  int y;
  deUint8 uncompressedBlockRGB [48];
  deUint8 uncompressedBlockAlpha [16];
  deUint64 compressedBlockRGB;
  deUint64 compressedBlockAlpha;
  int dstPixelSize;
  int dstRowPitch;
  deUint8 *dstPtr;
  deUint8 *src_local;
  PixelBufferAccess *dst_local;
  
  pvVar2 = PixelBufferAccess::getDataPtr(dst);
  iVar1 = ConstPixelBufferAccess::getRowPitch(&dst->super_ConstPixelBufferAccess);
  src_00 = EtcDecompressInternal::get128BitBlockStart(src,0);
  src_01 = EtcDecompressInternal::get128BitBlockEnd(src,0);
  EtcDecompressInternal::decompressETC2Block((deUint8 *)&x,src_01,(deUint8 *)0x0,false);
  EtcDecompressInternal::decompressEAC8Block(uncompressedBlockRGB + 0x28,src_00);
  for (srcPixelRGB._4_4_ = 0; srcPixelRGB._4_4_ < 4; srcPixelRGB._4_4_ = srcPixelRGB._4_4_ + 1) {
    for (srcPixelRGB._0_4_ = 0; (int)srcPixelRGB < 4; srcPixelRGB._0_4_ = (int)srcPixelRGB + 1) {
      lVar4 = (long)((srcPixelRGB._4_4_ * 4 + (int)srcPixelRGB) * 3);
      puVar3 = (undefined1 *)
               ((long)pvVar2 + (long)((int)srcPixelRGB << 2) + (long)(srcPixelRGB._4_4_ * iVar1));
      *puVar3 = *(undefined1 *)((long)&x + lVar4);
      puVar3[1] = *(undefined1 *)((long)&x + lVar4 + 1);
      puVar3[2] = *(undefined1 *)((long)&x + lVar4 + 2);
      puVar3[3] = uncompressedBlockRGB[(long)(srcPixelRGB._4_4_ * 4 + (int)srcPixelRGB) + 0x28];
    }
  }
  return;
}

Assistant:

void decompressETC2_EAC_RGBA8 (const PixelBufferAccess& dst, const deUint8* src)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8;

	const deUint64	compressedBlockAlpha	= get128BitBlockStart(src, 0);
	const deUint64	compressedBlockRGB		= get128BitBlockEnd(src, 0);
	deUint8			uncompressedBlockAlpha[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8];
	deUint8			uncompressedBlockRGB[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8];

	// Decompress.
	decompressETC2Block(uncompressedBlockRGB, compressedBlockRGB, NULL, false);
	decompressEAC8Block(uncompressedBlockAlpha, compressedBlockAlpha);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			const deUint8* const	srcPixelRGB		= &uncompressedBlockRGB[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8];
			const deUint8* const	srcPixelAlpha	= &uncompressedBlockAlpha[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8];
			deUint8* const			dstPixel		= dstPtr + y*dstRowPitch + x*dstPixelSize;

			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8 == 4);
			dstPixel[0] = srcPixelRGB[0];
			dstPixel[1] = srcPixelRGB[1];
			dstPixel[2] = srcPixelRGB[2];
			dstPixel[3] = srcPixelAlpha[0];
		}
	}
}